

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O2

void __thiscall higan::TcpConnection::ConnectionEstablished(TcpConnection *this)

{
  __shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2> local_30 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_28;
  
  if ((this->new_connection_callback_).super__Function_base._M_manager != (_Manager_type)0x0) {
    std::__shared_ptr<higan::TcpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<higan::TcpConnection,void>
              (local_30,(__weak_ptr<higan::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)this);
    std::function<void_(const_std::shared_ptr<higan::TcpConnection>_&)>::operator()
              (&this->new_connection_callback_,(shared_ptr<higan::TcpConnection> *)local_30);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28);
  }
  Channel::EnableReadable(&this->channel_);
  this->connecting_ = true;
  return;
}

Assistant:

void TcpConnection::ConnectionEstablished()
{
	if (new_connection_callback_)
	{
		new_connection_callback_(shared_from_this());
	}

	channel_.EnableReadable();
	connecting_ = true;
}